

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

void mg_value_destroy_ca(mg_value *val,mg_allocator *allocator)

{
  mg_allocator *allocator_00;
  mg_path *in_RSI;
  uint *in_RDI;
  
  if (in_RDI != (uint *)0x0) {
    allocator_00 = (mg_allocator *)(ulong)*in_RDI;
    switch(allocator_00) {
    case (mg_allocator *)0x0:
    case (mg_allocator *)0x1:
    case (mg_allocator *)0x2:
    case (mg_allocator *)0x3:
      break;
    case (mg_allocator *)0x4:
      mg_string_destroy_ca((mg_string *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x5:
      mg_list_destroy_ca((mg_list *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x6:
      mg_map_destroy_ca((mg_map *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x7:
      mg_node_destroy_ca((mg_node *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x8:
      mg_relationship_destroy_ca((mg_relationship *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x9:
      mg_unbound_relationship_destroy_ca((mg_unbound_relationship *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0xa:
      mg_path_destroy_ca(in_RSI,allocator_00);
      break;
    case (mg_allocator *)0xb:
      mg_date_destroy_ca((mg_date *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0xc:
      mg_time_destroy_ca((mg_time *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0xd:
      mg_local_time_destroy_ca((mg_local_time *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0xe:
      mg_date_time_destroy_ca((mg_date_time *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0xf:
      mg_date_time_zone_id_destroy_ca((mg_date_time_zone_id *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x10:
      mg_local_date_time_destroy_ca((mg_local_date_time *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x11:
      mg_duration_destroy_ca((mg_duration *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x12:
      mg_point_2d_destroy_ca((mg_point_2d *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x13:
      mg_point_3d_destroy_ca((mg_point_3d *)in_RSI,allocator_00);
      break;
    case (mg_allocator *)0x14:
    }
    mg_allocator_free((mg_allocator *)in_RSI,allocator_00);
  }
  return;
}

Assistant:

void mg_value_destroy_ca(mg_value *val, mg_allocator *allocator) {
  if (!val) {
    return;
  }
  switch (val->type) {
    case MG_VALUE_TYPE_NULL:
    case MG_VALUE_TYPE_BOOL:
    case MG_VALUE_TYPE_INTEGER:
    case MG_VALUE_TYPE_FLOAT:
      break;
    case MG_VALUE_TYPE_DATE:
      mg_date_destroy_ca(val->date_v, allocator);
      break;
    case MG_VALUE_TYPE_TIME:
      mg_time_destroy_ca(val->time_v, allocator);
      break;
    case MG_VALUE_TYPE_LOCAL_TIME:
      mg_local_time_destroy_ca(val->local_time_v, allocator);
      break;
    case MG_VALUE_TYPE_DATE_TIME:
      mg_date_time_destroy_ca(val->date_time_v, allocator);
      break;
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      mg_date_time_zone_id_destroy_ca(val->date_time_zone_id_v, allocator);
      break;
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      mg_local_date_time_destroy_ca(val->local_date_time_v, allocator);
      break;
    case MG_VALUE_TYPE_DURATION:
      mg_duration_destroy_ca(val->duration_v, allocator);
      break;
    case MG_VALUE_TYPE_POINT_2D:
      mg_point_2d_destroy_ca(val->point_2d_v, allocator);
      break;
    case MG_VALUE_TYPE_POINT_3D:
      mg_point_3d_destroy_ca(val->point_3d_v, allocator);
      break;
    case MG_VALUE_TYPE_STRING:
      mg_string_destroy_ca(val->string_v, allocator);
      break;
    case MG_VALUE_TYPE_LIST:
      mg_list_destroy_ca(val->list_v, allocator);
      break;
    case MG_VALUE_TYPE_MAP:
      mg_map_destroy_ca(val->map_v, allocator);
      break;
    case MG_VALUE_TYPE_NODE:
      mg_node_destroy_ca(val->node_v, allocator);
      break;
    case MG_VALUE_TYPE_RELATIONSHIP:
      mg_relationship_destroy_ca(val->relationship_v, allocator);
      break;
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      mg_unbound_relationship_destroy_ca(val->unbound_relationship_v,
                                         allocator);
      break;
    case MG_VALUE_TYPE_PATH:
      mg_path_destroy_ca(val->path_v, allocator);
      break;
    case MG_VALUE_TYPE_UNKNOWN:
      break;
  }
  mg_allocator_free(allocator, val);
}